

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  char *key;
  char *str;
  uint uVar1;
  ulong __size;
  ulong size;
  
  uVar1 = 0xffffffb0;
  while( true ) {
    size = (ulong)(uVar1 + 0x50);
    if ((chunkLength <= size) || (data[size] == '\0')) break;
    uVar1 = uVar1 + 1;
  }
  if (uVar1 < 0xffffffb1) {
    uVar1 = 0x59;
    key = (char *)0x0;
    str = (char *)0x0;
  }
  else {
    __size = (ulong)(uVar1 + 0x51);
    key = (char *)malloc(__size);
    if (key == (char *)0x0) {
      key = (char *)0x0;
    }
    else {
      lodepng_memcpy(key,data,size);
      key[size] = '\0';
      uVar1 = (int)chunkLength - (uVar1 + 0x51);
      if (chunkLength < __size) {
        uVar1 = 0;
      }
      str = (char *)malloc((ulong)(uVar1 + 1));
      if (str != (char *)0x0) {
        lodepng_memcpy(str,data + __size,(ulong)uVar1);
        str[uVar1] = '\0';
        uVar1 = lodepng_add_text(info,key,str);
        goto LAB_0014acf4;
      }
    }
    str = (char *)0x0;
    uVar1 = 0x53;
  }
LAB_0014acf4:
  free(key);
  free(str);
  return uVar1;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(str, data + string2_begin, length);
    str[length] = 0;

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}